

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBufferRegion
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffVk,Uint64 DstOffset,Uint64 NumBytes,
          VkBuffer vkSrcBuffer,Uint64 SrcOffset,RESOURCE_STATE_TRANSITION_MODE TransitionMode)

{
  BufferDesc *pBVar1;
  Char *pCVar2;
  VkBuffer_T *pVVar3;
  VkBuffer dstBuffer;
  undefined1 local_a0 [8];
  string msg_1;
  VkBufferCopy CopyRegion;
  undefined1 local_58 [8];
  string msg;
  Uint64 SrcOffset_local;
  VkBuffer vkSrcBuffer_local;
  Uint64 NumBytes_local;
  Uint64 DstOffset_local;
  BufferVkImpl *pBuffVk_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = SrcOffset;
  pBVar1 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)pBuffVk);
  if (pBVar1->Size < DstOffset + NumBytes) {
    FormatString<char[81]>
              ((string *)local_58,
               (char (*) [81])
               "Update region is out of buffer bounds which will result in an undefined behavior");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x82a);
    std::__cxx11::string::~string((string *)local_58);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,pBuffVk,TransitionMode,RESOURCE_STATE_COPY_DEST,VK_ACCESS_TRANSFER_WRITE_BIT,
             "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");
  msg_1.field_2._8_8_ = msg.field_2._8_8_;
  pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&pBuffVk->m_VulkanBuffer);
  if (pVVar3 == (VkBuffer_T *)0x0) {
    FormatString<char[49]>
              ((string *)local_a0,(char (*) [49])"Copy destination buffer must not be suballocated")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x833);
    std::__cxx11::string::~string((string *)local_a0);
  }
  dstBuffer = BufferVkImpl::GetVkBuffer(pBuffVk);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,vkSrcBuffer,dstBuffer,1,
             (VkBufferCopy *)((long)&msg_1.field_2 + 8));
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBufferRegion(BufferVkImpl*                  pBuffVk,
                                             Uint64                         DstOffset,
                                             Uint64                         NumBytes,
                                             VkBuffer                       vkSrcBuffer,
                                             Uint64                         SrcOffset,
                                             RESOURCE_STATE_TRANSITION_MODE TransitionMode)
{
    DEV_CHECK_ERR(DstOffset + NumBytes <= pBuffVk->GetDesc().Size,
                  "Update region is out of buffer bounds which will result in an undefined behavior");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pBuffVk, TransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset;
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = NumBytes;
    VERIFY(pBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    m_CommandBuffer.CopyBuffer(vkSrcBuffer, pBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}